

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::rpc_session::stop(rpc_session *this)

{
  bool bVar1;
  rpc_session *in_RDI;
  bool in_stack_0000002f;
  rpc_session *in_stack_00000030;
  enable_shared_from_this<nuraft::rpc_session> *in_stack_ffffffffffffffb8;
  function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *this_00;
  
  invoke_connection_callback(in_stack_00000030,in_stack_0000002f);
  close_socket(in_RDI);
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *)0x41f945);
  if (bVar1) {
    this_00 = &in_RDI->callback_;
    std::enable_shared_from_this<nuraft::rpc_session>::shared_from_this(in_stack_ffffffffffffffb8);
    std::function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)>::operator()
              (this_00,(shared_ptr<nuraft::rpc_session> *)in_stack_ffffffffffffffb8);
    std::shared_ptr<nuraft::rpc_session>::~shared_ptr((shared_ptr<nuraft::rpc_session> *)0x41f988);
  }
  std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
  return;
}

Assistant:

void stop() {
        invoke_connection_callback(false);
        close_socket();
        if (callback_) {
            callback_(this->shared_from_this());
        }
        handler_.reset();
    }